

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O1

bool __thiscall
pktalloc::LightVector<siamese::DecoderSubwindow_*,_25U>::SetSize_Copy
          (LightVector<siamese::DecoderSubwindow_*,_25U> *this,uint elements)

{
  LightVector<siamese::DecoderSubwindow_*,_25U> *__src;
  bool bVar1;
  DecoderSubwindow **__dest;
  uint uVar2;
  
  if (this->Allocated < elements) {
    uVar2 = elements * 3 >> 1;
    __dest = (DecoderSubwindow **)operator_new__((ulong)uVar2 * 8,(nothrow_t *)&std::nothrow);
    if (__dest != (DecoderSubwindow **)0x0) {
      __src = (LightVector<siamese::DecoderSubwindow_*,_25U> *)this->DataPtr;
      this->Allocated = uVar2;
      this->DataPtr = __dest;
      memcpy(__dest,__src,(ulong)this->Size << 3);
      if (__src != (LightVector<siamese::DecoderSubwindow_*,_25U> *)0x0 && __src != this) {
        operator_delete__(__src);
      }
      if (__dest != (DecoderSubwindow **)0x0) goto LAB_0014a8a3;
    }
    bVar1 = false;
  }
  else {
LAB_0014a8a3:
    this->Size = elements;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool SetSize_Copy(unsigned elements)
    {
        PKTALLOC_DEBUG_ASSERT(Size <= Allocated);

        // If it is actually expanding, and it needs to grow:
        if (elements > Allocated)
        {
            const unsigned newAllocated = (elements * 3) / 2;
            T* newData = new(std::nothrow) T[newAllocated];
            if (!newData) {
                return false;
            }
            T* oldData = DataPtr;
            Allocated  = newAllocated;
            DataPtr    = newData;

            // Copy data before deletion
            memcpy(newData, oldData, sizeof(T) * Size);

            if (oldData != &PreallocatedData[0]) {
                delete[] oldData;
            }
        }

        Size = elements;
        return true;
    }